

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

void __thiscall
ON_PolynomialSurface::ON_PolynomialSurface(ON_PolynomialSurface *this,ON_BezierSurface *src)

{
  ON_Interval *local_30;
  ON_BezierSurface *src_local;
  ON_PolynomialSurface *this_local;
  
  ON_4dPointArray::ON_4dPointArray(&this->m_cv);
  local_30 = (ON_Interval *)&this->field_0x28;
  do {
    ON_Interval::ON_Interval(local_30);
    local_30 = local_30 + 1;
  } while ((ON_PolynomialSurface *)local_30 != this + 1);
  this->m_order[0] = 0;
  this->m_order[1] = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0x3ff0000000000000;
  *(undefined8 *)&this->field_0x38 = 0;
  *(undefined8 *)&this->field_0x40 = 0x3ff0000000000000;
  operator=(this,src);
  return;
}

Assistant:

ON_PolynomialSurface::ON_PolynomialSurface(const ON_BezierSurface& src)
{
  m_order[0] = 0;
  m_order[1] = 0;
  m_domain[0].m_t[0] = 0.0;
  m_domain[0].m_t[1] = 1.0;
  m_domain[1].m_t[0] = 0.0;
  m_domain[1].m_t[1] = 1.0;
  *this = src;
}